

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>_>
                *matrix,vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                        *rows)

{
  uint uVar1;
  int iVar2;
  pointer plVar3;
  node_ptr plVar4;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  *pEVar5;
  Index IVar6;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *pvVar7;
  bool bVar8;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r;
  node_ptr plVar9;
  pointer ppEVar10;
  pointer ppEVar11;
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>
  *r_1;
  undefined4 local_304;
  undefined *local_300;
  undefined1 local_2f8 [16];
  undefined **local_2e8;
  ulong local_2e0;
  shared_count sStack_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  shared_count sStack_2b8;
  undefined **local_2b0;
  undefined1 local_2a8;
  undefined8 *local_2a0;
  undefined ***local_298;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  *local_290;
  char *local_288;
  undefined **local_280;
  char *local_278;
  shared_count sStack_270;
  char *local_268;
  vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
  *local_260;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>_>
  *local_258;
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  local_250;
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
  local_1e0;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_250,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1e0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_250);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&local_250);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1e0);
  build_column_values<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_250,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&local_1e0,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)&local_250);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)&local_250);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&local_1e0);
  local_258 = matrix;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>
  ::
  Vector_column<std::vector<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>
              *)&local_1e0,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  plVar3 = (rows->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_260 = rows;
  IVar6 = local_1e0.super_Row_access_option.columnIndex_;
  ppEVar10 = local_1e0.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar11 = local_1e0.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_250.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1e0.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (plVar9 = (node_ptr)
                (rows->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    local_1e0.super_Row_access_option.columnIndex_ = IVar6;
    local_1e0.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppEVar10;
    local_1e0.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar11;
    local_1e0.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_250.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[1].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x215);
        local_2e0 = local_2e0 & 0xffffffffffffff00;
        local_2e8 = &PTR__lazy_ostream_0020a440;
        sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2d0 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_2f8._0_4_ = iVar2;
        local_300 = (undefined *)CONCAT44(local_300._4_4_,6);
        local_280 = (undefined **)CONCAT71(local_280._1_7_,iVar2 == 6);
        local_278 = (char *)0x0;
        sStack_270.pi_ = (sp_counted_base *)0x0;
        local_2c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_2c0 = "";
        local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                     *)local_2f8;
        local_250.super_Row_access_option.rows_ =
             (Row_container *)((ulong)local_250.super_Row_access_option.rows_ & 0xffffffffffffff00);
        local_250.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0020a940;
        local_250.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&boost::unit_test::lazy_ostream::inst;
        local_250.column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = &local_290;
        local_2f8._8_8_ = &local_300;
        local_2a8 = 0;
        local_2b0 = &PTR__lazy_ostream_0020a6c0;
        local_2a0 = &boost::unit_test::lazy_ostream::inst;
        local_298 = (undefined ***)(local_2f8 + 8);
        boost::test_tools::tt_detail::report_assertion
                  (&local_280,&local_2e8,&local_2c8,0x215,1,2,2,"entry.get_column_index()",
                   &local_250,"6",&local_2b0);
        boost::detail::shared_count::~shared_count(&sStack_270);
      }
    }
    IVar6 = local_1e0.super_Row_access_option.columnIndex_;
    ppEVar10 = local_1e0.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar11 = local_1e0.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_250.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e0.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_1e0.super_Row_access_option.columnIndex_ = 0;
  local_250.super_Row_access_option._4_4_ =
       SUB84((ulong)local_250.super_Row_access_option._0_8_ >> 0x20,0);
  local_250.super_Row_access_option.columnIndex_ = IVar6;
  local_1e0.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250.super_Row_access_option.rows_ = local_1e0.super_Row_access_option.rows_;
  local_250.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppEVar10;
  local_250.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppEVar11;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&local_250.erasedValues_._M_h,&local_1e0.erasedValues_,&local_1e0.erasedValues_);
  local_250.operators_._0_4_ = local_1e0.operators_._0_4_;
  local_250.operators_._4_4_ = local_1e0.operators_._4_4_;
  local_250.entryPool_._0_4_ = local_1e0.entryPool_._0_4_;
  local_250.entryPool_._4_4_ = local_1e0.entryPool_._4_4_;
  local_1e0.operators_ = (Field_operators *)0x0;
  local_1e0.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0020a440;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_300 = (undefined *)
              (((long)local_250.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_250.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              local_250.erasedValues_._M_h._M_element_count);
  local_2f8._8_8_ = &local_300;
  local_2f8._0_8_ = &local_304;
  local_304 = 4;
  local_2c0 = (char *)0x0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
               *)0x1cc8e6;
  local_288 = "";
  local_298 = (undefined ***)(local_2f8 + 8);
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a400;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = local_2f8;
  local_2e0 = local_2e0 & 0xffffffffffffff00;
  local_2e8 = &PTR__lazy_ostream_0020a6c0;
  sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2c8._0_1_ = local_300 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0020a440;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_300 = (undefined *)
              (((long)local_1e0.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e0.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              local_1e0.erasedValues_._M_h._M_element_count);
  local_2c8 = (char *)CONCAT71(local_2c8._1_7_,local_300 == (undefined *)0x0);
  local_304 = 0;
  local_2c0 = (char *)0x0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
               *)0x1cc8e6;
  local_288 = "";
  local_2f8._8_8_ = &local_300;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a400;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = (undefined ***)(local_2f8 + 8);
  local_2f8._0_8_ = &local_304;
  local_2e0 = local_2e0 & 0xffffffffffffff00;
  local_2e8 = &PTR__lazy_ostream_0020a6c0;
  sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_280,&local_290,0x21d,1,2,2,"col.size()",&local_2b0,"0",&local_2e8);
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_258->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&local_250);
  local_2e8 = (undefined **)CONCAT71(local_2e8._1_7_,bVar8);
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined **)0x1d6ae2;
  local_278 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a3b0;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_298 = &local_280;
  boost::test_tools::tt_detail::report_assertion();
  pvVar7 = local_260;
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  plVar3 = (pvVar7->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (plVar9 = (node_ptr)
                (pvVar7->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[1].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x22d,
                   &local_150);
        local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
        local_280 = &PTR__lazy_ostream_0020a440;
        sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_268 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_300 = (undefined *)CONCAT44(local_300._4_4_,iVar2);
        local_304 = 6;
        local_2c8 = (char *)CONCAT71(local_2c8._1_7_,iVar2 == 6);
        local_2c0 = (char *)0x0;
        sStack_2b8.pi_ = (sp_counted_base *)0x0;
        local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                     *)0x1cc8e6;
        local_288 = "";
        local_2f8._8_8_ = &local_300;
        local_2a8 = 0;
        local_2b0 = &PTR__lazy_ostream_0020a940;
        local_2a0 = &boost::unit_test::lazy_ostream::inst;
        local_298 = (undefined ***)(local_2f8 + 8);
        local_2f8._0_8_ = &local_304;
        local_2e0 = local_2e0 & 0xffffffffffffff00;
        local_2e8 = &PTR__lazy_ostream_0020a6c0;
        sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2d0 = local_2f8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2c8,&local_280,&local_290,0x22d,1,2,2,"entry.get_column_index()",
                   &local_2b0,"6",&local_2e8);
        boost::detail::shared_count::~shared_count(&sStack_2b8);
      }
    }
  }
  Gudhi::persistence_matrix::swap(&local_1e0,&local_250);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0020a440;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_300 = (undefined *)
              (((long)local_250.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_250.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              local_250.erasedValues_._M_h._M_element_count);
  local_304 = 0;
  local_2c0 = (char *)0x0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
               *)0x1cc8e6;
  local_288 = "";
  local_2f8._8_8_ = &local_300;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a400;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = (undefined ***)(local_2f8 + 8);
  local_2f8._0_8_ = &local_304;
  local_2e0 = local_2e0 & 0xffffffffffffff00;
  local_2e8 = &PTR__lazy_ostream_0020a6c0;
  sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = local_2f8;
  local_2c8._0_1_ = local_300 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0020a440;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_300 = (undefined *)
              (((long)local_1e0.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e0.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              local_1e0.erasedValues_._M_h._M_element_count);
  local_2c8 = (char *)CONCAT71(local_2c8._1_7_,local_300 == (undefined *)0x4);
  local_304 = 4;
  local_2c0 = (char *)0x0;
  sStack_2b8.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
               *)0x1cc8e6;
  local_288 = "";
  local_2f8._8_8_ = &local_300;
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a400;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_298 = (undefined ***)(local_2f8 + 8);
  local_2f8._0_8_ = &local_304;
  local_2e0 = local_2e0 & 0xffffffffffffff00;
  local_2e8 = &PTR__lazy_ostream_0020a6c0;
  sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d0 = local_2f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_2c8,&local_280,&local_290,0x235,1,2,2,"col.size()",&local_2b0,"4",&local_2e8);
  boost::detail::shared_count::~shared_count(&sStack_2b8);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar8 = Gudhi::persistence_matrix::operator==
                    ((local_258->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&local_1e0);
  local_2e8 = (undefined **)CONCAT71(local_2e8._1_7_,bVar8);
  local_2e0 = 0;
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined **)0x1d6af7;
  local_278 = "";
  local_2a8 = 0;
  local_2b0 = &PTR__lazy_ostream_0020a3b0;
  local_2a0 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_298 = &local_280;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  plVar3 = (local_260->
           super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppEVar10 = local_250.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  for (plVar9 = (node_ptr)
                (local_260->
                super__Vector_base<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::allocator<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_250.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppEVar10, plVar9 != (node_ptr)plVar3;
      plVar9 = plVar9 + 1) {
    plVar4 = (((type *)&plVar9->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar9 != plVar4 && plVar4 != (node_ptr)0x0) {
      plVar4 = plVar9->prev_;
      uVar1 = *(uint *)&plVar4[1].next_;
      if ((uVar1 < 6) && ((0x2bU >> (uVar1 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x245,
                   &local_170);
        local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
        local_280 = &PTR__lazy_ostream_0020a440;
        sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_268 = "";
        iVar2 = *(int *)&plVar4[-1].prev_;
        local_300 = (undefined *)CONCAT44(local_300._4_4_,iVar2);
        local_304 = 6;
        local_2c8 = (char *)CONCAT71(local_2c8._1_7_,iVar2 == 6);
        local_2c0 = (char *)0x0;
        sStack_2b8.pi_ = (sp_counted_base *)0x0;
        local_290 = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                     *)0x1cc8e6;
        local_288 = "";
        local_2f8._8_8_ = &local_300;
        local_2a8 = 0;
        local_2b0 = &PTR__lazy_ostream_0020a940;
        local_2a0 = &boost::unit_test::lazy_ostream::inst;
        local_298 = (undefined ***)(local_2f8 + 8);
        local_2f8._0_8_ = &local_304;
        local_2e0 = local_2e0 & 0xffffffffffffff00;
        local_2e8 = &PTR__lazy_ostream_0020a6c0;
        sStack_2d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_2d0 = local_2f8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_2c8,&local_280,&local_290,0x245,1,2,2,"entry.get_column_index()",
                   &local_2b0,"6",&local_2e8);
        boost::detail::shared_count::~shared_count(&sStack_2b8);
      }
    }
    ppEVar10 = local_250.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  for (; ppEVar10 !=
         local_250.column_.
         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish; ppEVar10 = ppEVar10 + 1) {
    pEVar5 = *ppEVar10;
    if (((local_250.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (pEVar5 != (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                    *)0x0)) &&
       (plVar9 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar9 != (node_ptr)0x0)) {
      plVar4 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar4->next_ = plVar9;
      plVar9->prev_ = plVar4;
    }
    operator_delete(pEVar5,0x20);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_250.erasedValues_._M_h);
  ppEVar11 = local_1e0.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar10 = local_1e0.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_250.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    ppEVar11 = local_1e0.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppEVar10 = local_1e0.column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppEVar11 != ppEVar10; ppEVar11 = ppEVar11 + 1) {
    pEVar5 = *ppEVar11;
    if (((local_1e0.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (pEVar5 != (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                    *)0x0)) &&
       (plVar9 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar9 != (node_ptr)0x0)) {
      plVar4 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar4->next_ = plVar9;
      plVar9->prev_ = plVar4;
    }
    operator_delete(pEVar5,0x20);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1e0.erasedValues_._M_h);
  if (local_1e0.column_.
      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.column_.
                    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}